

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardDemodulation.cpp
# Opt level: O0

bool __thiscall
Inferences::ForwardDemodulationImpl<true>::perform
          (ForwardDemodulationImpl<true> *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  TypedTermList t;
  SingletonIterator<Kernel::Clause_*> it_00;
  TermList tgtTerm;
  Ordering *pOVar1;
  bool bVar2;
  int iVar3;
  Result RVar4;
  Literal **ppLVar5;
  pointer this_00;
  TermList TVar6;
  undefined8 *in_RDX;
  Clause *in_RSI;
  long in_RDI;
  SingletonIterator<Kernel::Clause_*> SVar7;
  Literal *curr;
  uint i;
  RStack<Literal_*> resLits;
  Literal *resLit;
  TermList rhsS;
  Result litOrder;
  bool preordered;
  AppliedTerm rhsApplied;
  SubstApplicator *appl;
  Applicator applWithoutEqSort;
  ApplicatorWithEqSort applWithEqSort;
  SmartPtr<Indexing::ResultSubstitution> subs;
  TermList eqSort;
  TermList querySort;
  TypedTermList lhs;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData> qr;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
  git;
  bool redundancyCheck;
  TypedTermList trm;
  type it;
  Literal *lit;
  uint li;
  uint cLen;
  Ordering *ordering;
  SimplifyingInference2 *in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  TermList in_stack_fffffffffffffc18;
  TermList in_stack_fffffffffffffc20;
  TermList in_stack_fffffffffffffc28;
  RobSubstitution *in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  TermList in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  ProofExtra in_stack_fffffffffffffc4c;
  TermList in_stack_fffffffffffffc50;
  Inference *in_stack_fffffffffffffc78;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffffc80;
  Clause *in_stack_fffffffffffffc88;
  undefined6 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  TermList in_stack_fffffffffffffcb8;
  undefined7 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc7;
  TermList in_stack_fffffffffffffcc8;
  SubstApplicator *in_stack_fffffffffffffce0;
  SimplifyingInference2 *local_318;
  SimplifyingInference2 local_290;
  Inference local_278;
  undefined1 local_248;
  Clause *local_240;
  Term *local_230;
  uint local_224;
  undefined1 local_210;
  Clause *in_stack_fffffffffffffdf8;
  AppliedTerm local_198;
  byte local_179;
  uint64_t local_178;
  ApplicatorWithEqSort *local_170;
  TermIndex<Indexing::DemodulatorData> *pTStack_168;
  RobSubstitution *local_160;
  SimplifyingInference2 *local_158;
  undefined1 local_150 [40];
  SmartPtr<Indexing::ResultSubstitution> local_128;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  int local_e4;
  SmartPtr<Indexing::ResultSubstitution> local_e0;
  TypedTermList *local_d0;
  uint64_t local_b0;
  byte local_a1;
  uint64_t local_a0;
  TypedTermList local_98 [4];
  Term *local_50;
  uint local_44;
  uint local_40;
  Ordering *local_30;
  undefined8 *local_20;
  Clause *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x7b2a70);
  if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted
       == '\0') &&
     (iVar3 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                   ::attempted), iVar3 != 0)) {
    Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHSet
              ((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x7b2a9e);
    __cxa_atexit(Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet,
                 &perform::attempted,&__dso_handle);
    __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                         ::attempted);
  }
  Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            ((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x7b2ad2);
  local_40 = Kernel::Clause::length(local_18);
  for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
    ppLVar5 = Kernel::Clause::operator[](local_18,local_44);
    local_50 = &(*ppLVar5)->super_Term;
    bVar2 = Kernel::Literal::isAnswerLiteral((Literal *)in_stack_fffffffffffffc20._content);
    if ((!bVar2) &&
       (((*(byte *)(in_RDI + 0x13) & 1) == 0 ||
        (bVar2 = Kernel::Literal::isEquality((Literal *)0x7b2b7c), bVar2)))) {
      Kernel::FirstOrderSubtermIt::FirstOrderSubtermIt
                ((FirstOrderSubtermIt *)
                 CONCAT17(in_stack_fffffffffffffc97,
                          CONCAT16(in_stack_fffffffffffffc96,in_stack_fffffffffffffc90)),
                 (Term *)in_stack_fffffffffffffc88,SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0)
                );
      do {
        while( true ) {
          bVar2 = Kernel::FirstOrderSubtermIt::hasNext((FirstOrderSubtermIt *)0x7b2ba9);
          if (!bVar2) {
            local_e4 = 0;
            goto LAB_007b3974;
          }
          Kernel::FirstOrderSubtermIt::next
                    ((FirstOrderSubtermIt *)in_stack_fffffffffffffc50._content);
          Kernel::TypedTermList::TypedTermList
                    ((TypedTermList *)in_stack_fffffffffffffc20._content,
                     (Term *)in_stack_fffffffffffffc18._content);
          local_a0 = local_98[0].super_TermList._content;
          bVar2 = Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                            ((DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                             in_stack_fffffffffffffc18._content,in_stack_fffffffffffffc20);
          if (bVar2) break;
          Kernel::FirstOrderSubtermIt::right
                    ((FirstOrderSubtermIt *)
                     CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
        }
        local_b0 = local_98[0].super_TermList._content;
        local_a1 = DemodulationHelper::redundancyCheckNeededForPremise
                             ((DemodulationHelper *)in_stack_fffffffffffffc20._content,
                              (Clause *)in_stack_fffffffffffffc18._content,
                              (Literal *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              in_stack_fffffffffffffc28);
        Kernel::TermList::term((TermList *)0x7b2ccb);
        Kernel::TypedTermList::TypedTermList
                  ((TypedTermList *)in_stack_fffffffffffffc20._content,
                   (Term *)in_stack_fffffffffffffc18._content);
        t._sort._content._0_4_ = in_stack_fffffffffffffc38;
        t.super_TermList._content = (uint64_t)in_stack_fffffffffffffc30;
        t._sort._content._4_4_ = in_stack_fffffffffffffc3c;
        Indexing::TermIndex<Indexing::DemodulatorData>::getGeneralizations
                  ((TermIndex<Indexing::DemodulatorData> *)in_stack_fffffffffffffc28._content,t,
                   SUB81(in_stack_fffffffffffffc20._content >> 0x38,0));
        do {
          bVar2 = Lib::
                  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
                  ::hasNext((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
                             *)0x7b2d28);
          if (!bVar2) {
            local_e4 = 0;
            break;
          }
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
          ::next((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
                  *)in_stack_fffffffffffffc08);
          Kernel::Clause::color
                    ((Clause *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          Kernel::Clause::color
                    ((Clause *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          bVar2 = Kernel::ColorHelper::compatible(COLOR_TRANSPARENT,0x7b2d9b);
          if (bVar2) {
            local_f8 = (local_d0->super_TermList)._content;
            local_f0 = (local_d0->_sort)._content;
            if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::
                 eqSortSubs == '\0') &&
               (iVar3 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                             ::eqSortSubs), iVar3 != 0)) {
              Kernel::RobSubstitution::RobSubstitution(in_stack_fffffffffffffc30);
              __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&perform::eqSortSubs,
                           &__dso_handle);
              __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                   ::eqSortSubs);
            }
            bVar2 = Kernel::TermList::isVar
                              ((TermList *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            if (bVar2) {
              Kernel::RobSubstitution::reset
                        ((RobSubstitution *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
              local_100 = (uint64_t)Kernel::TypedTermList::sort(local_98);
              local_110 = (uint64_t)Kernel::TypedTermList::sort(local_d0);
              local_118 = local_100;
              TVar6._content._4_4_ = in_stack_fffffffffffffc4c;
              TVar6._content._0_4_ = in_stack_fffffffffffffc48;
              local_108 = local_110;
              bVar2 = Kernel::RobSubstitution::match
                                ((RobSubstitution *)in_stack_fffffffffffffc40._content,
                                 in_stack_fffffffffffffc50,in_stack_fffffffffffffc3c,TVar6,
                                 in_stack_fffffffffffffc38);
              if (!bVar2) {
                local_e4 = 7;
                goto LAB_007b3902;
              }
            }
            Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr(&local_128,&local_e0);
            Lib::SmartPtr<Indexing::ResultSubstitution>::ptr(&local_128);
            anon_unknown_6::ApplicatorWithEqSort::ApplicatorWithEqSort
                      ((ApplicatorWithEqSort *)in_stack_fffffffffffffc20._content,
                       (ResultSubstitution *)in_stack_fffffffffffffc18._content,
                       (RobSubstitution *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            Lib::SmartPtr<Indexing::ResultSubstitution>::ptr(&local_128);
            anon_unknown_6::Applicator::Applicator
                      ((Applicator *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                       (ResultSubstitution *)in_stack_fffffffffffffc08);
            bVar2 = Kernel::TermList::isVar
                              ((TermList *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            if (bVar2) {
              local_318 = (SimplifyingInference2 *)(local_150 + 0x10);
            }
            else {
              local_318 = (SimplifyingInference2 *)local_150;
            }
            local_158 = local_318;
            local_178 = local_d0[1].super_TermList._content;
            Kernel::AppliedTerm::AppliedTerm
                      ((AppliedTerm *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                       in_stack_fffffffffffffc40,(SubstApplicator *)in_stack_fffffffffffffc30,
                       SUB81(in_stack_fffffffffffffc28._content >> 0x38,0));
            pOVar1 = local_30;
            local_179 = (byte)local_d0[2].super_TermList._content & 1;
            if ((*(byte *)(in_RDI + 0x12) & 1) == 0) {
              if (local_179 != 0) goto LAB_007b3254;
              if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
                Kernel::AppliedTerm::AppliedTerm(&local_198,local_98[0].super_TermList);
                in_stack_fffffffffffffc08 =
                     (SimplifyingInference2 *)
                     CONCAT44(local_198.term._content._4_4_,(undefined4)local_198.term._content);
                in_stack_fffffffffffffc10 = local_198._8_4_;
                in_stack_fffffffffffffc14 = local_198._12_4_;
                in_stack_fffffffffffffc18._content = (uint64_t)local_198.applicator;
                in_stack_fffffffffffffc20._content = (uint64_t)local_170;
                in_stack_fffffffffffffc28._content = (uint64_t)pTStack_168;
                in_stack_fffffffffffffc30 = local_160;
                iVar3 = (*pOVar1->_vptr_Ordering[5])();
                if (iVar3 == 1) goto LAB_007b3254;
              }
              local_e4 = 7;
            }
            else {
              this_00 = std::
                        unique_ptr<Kernel::TermOrderingDiagram,_std::default_delete<Kernel::TermOrderingDiagram>_>
                        ::operator->((unique_ptr<Kernel::TermOrderingDiagram,_std::default_delete<Kernel::TermOrderingDiagram>_>
                                      *)0x7b30b4);
              Kernel::TermOrderingDiagram::init(this_00,(EVP_PKEY_CTX *)local_158);
              if ((local_179 & 1) == 0) {
                if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
                  std::
                  unique_ptr<Kernel::TermOrderingDiagram,_std::default_delete<Kernel::TermOrderingDiagram>_>
                  ::operator->((unique_ptr<Kernel::TermOrderingDiagram,_std::default_delete<Kernel::TermOrderingDiagram>_>
                                *)0x7b30f3);
                  in_stack_fffffffffffffce0 =
                       (SubstApplicator *)
                       Kernel::TermOrderingDiagram::next
                                 ((TermOrderingDiagram *)in_stack_fffffffffffffdf8);
                  if (in_stack_fffffffffffffce0 != (SubstApplicator *)0x0) goto LAB_007b3254;
                }
                local_e4 = 7;
              }
              else {
LAB_007b3254:
                if (((local_a1 & 1) != 0) && ((*(byte *)(in_RDI + 0x11) & 1) != 0)) {
                  RVar4 = Kernel::Ordering::getEqualityArgumentOrder
                                    ((Ordering *)
                                     CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                                     (Literal *)in_stack_fffffffffffffc30);
                  in_stack_fffffffffffffcc8._content =
                       (uint64_t)Kernel::Term::nthArgument(local_50,0);
                  in_stack_fffffffffffffcc7 =
                       Kernel::TermList::operator==
                                 (&local_98[0].super_TermList,
                                  (TermList *)in_stack_fffffffffffffcc8._content);
                  if ((!(bool)in_stack_fffffffffffffcc7) || (RVar4 != LESS)) {
                    in_stack_fffffffffffffcb8._content =
                         (uint64_t)Kernel::Term::nthArgument(local_50,1);
                    in_stack_fffffffffffffcb7 =
                         Kernel::TermList::operator==
                                   (&local_98[0].super_TermList,
                                    (TermList *)in_stack_fffffffffffffcb8._content);
                    if ((!(bool)in_stack_fffffffffffffcb7) || (RVar4 != GREATER)) goto LAB_007b3349;
                  }
                  local_a1 = 0;
                }
LAB_007b3349:
                TVar6 = Kernel::AppliedTerm::apply(in_stack_fffffffffffffc18._content);
                if (((local_a1 & 1) == 0) ||
                   (tgtTerm._content._7_1_ = in_stack_fffffffffffffcc7,
                   tgtTerm._content._0_7_ = in_stack_fffffffffffffcc0,
                   in_stack_fffffffffffffc08 = local_158,
                   in_stack_fffffffffffffca7 =
                        DemodulationHelper::isPremiseRedundant
                                  ((DemodulationHelper *)
                                   CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                                   (Clause *)TVar6._content,
                                   (Literal *)
                                   CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                                   in_stack_fffffffffffffcc8,tgtTerm,in_stack_fffffffffffffcb8,
                                   in_stack_fffffffffffffce0), (bool)in_stack_fffffffffffffca7)) {
                  Kernel::EqHelper::replace
                            ((Literal *)
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                             in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                  in_stack_fffffffffffffc97 =
                       Kernel::EqHelper::isEqTautology
                                 ((Literal *)
                                  CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
                  if ((bool)in_stack_fffffffffffffc97) {
                    *(int *)(DAT_01333840 + 0x14c) = *(int *)(DAT_01333840 + 0x14c) + 1;
                    SVar7 = Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0x7b34c2);
                    in_stack_fffffffffffffc88 = SVar7._el;
                    in_stack_fffffffffffffc96 = SVar7._finished;
                    SVar7._el._0_4_ = in_stack_fffffffffffffc48;
                    SVar7._0_8_ = in_stack_fffffffffffffc40._content;
                    SVar7._el._4_4_ = in_stack_fffffffffffffc4c;
                    local_210 = in_stack_fffffffffffffc96;
                    in_stack_fffffffffffffdf8 = in_stack_fffffffffffffc88;
                    Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(SVar7);
                    Lib::VirtualIterator<Kernel::Clause_*>::operator=
                              ((VirtualIterator<Kernel::Clause_*> *)
                               in_stack_fffffffffffffc20._content,
                               (VirtualIterator<Kernel::Clause_*> *)
                               in_stack_fffffffffffffc18._content);
                    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                              ((VirtualIterator<Kernel::Clause_*> *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
                    local_1 = 1;
                    local_e4 = 1;
                  }
                  else {
                    Lib::
                    Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    ::Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
                    in_stack_fffffffffffffc80 =
                         Lib::
                         Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                       *)0x7b358d);
                    Lib::Stack<Kernel::Literal_*>::push
                              ((Stack<Kernel::Literal_*> *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                               (Literal *)in_stack_fffffffffffffc08);
                    for (local_224 = 0; local_224 < local_40; local_224 = local_224 + 1) {
                      in_stack_fffffffffffffc78 =
                           (Inference *)Kernel::Clause::operator[](local_18,local_224);
                      local_230 = *(Term **)in_stack_fffffffffffffc78;
                      if (local_230 != local_50) {
                        Lib::
                        Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                      *)0x7b3611);
                        Lib::Stack<Kernel::Literal_*>::push
                                  ((Stack<Kernel::Literal_*> *)
                                   CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                   (Literal *)in_stack_fffffffffffffc08);
                      }
                    }
                    *(int *)(DAT_01333840 + 0x148) = *(int *)(DAT_01333840 + 0x148) + 1;
                    SVar7 = Lib::getSingletonIterator<Kernel::Clause*>((Clause *)0x7b3689);
                    local_240 = SVar7._el;
                    local_248 = SVar7._finished;
                    it_00._el._0_4_ = in_stack_fffffffffffffc48;
                    it_00._0_8_ = in_stack_fffffffffffffc40._content;
                    it_00._el._4_4_ = in_stack_fffffffffffffc4c;
                    Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it_00);
                    Lib::VirtualIterator<Kernel::Clause_*>::operator=
                              ((VirtualIterator<Kernel::Clause_*> *)
                               in_stack_fffffffffffffc20._content,
                               (VirtualIterator<Kernel::Clause_*> *)
                               in_stack_fffffffffffffc18._content);
                    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                              ((VirtualIterator<Kernel::Clause_*> *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
                    Lib::
                    Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    ::operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                 *)0x7b36fb);
                    Kernel::SimplifyingInference2::SimplifyingInference2
                              (&local_290,FORWARD_DEMODULATION,local_18,
                               (Clause *)local_d0[1]._sort._content);
                    Kernel::Inference::Inference
                              ((Inference *)
                               CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                               in_stack_fffffffffffffc08);
                    in_stack_fffffffffffffc50._content =
                         (uint64_t)
                         Kernel::Clause::fromStack
                                   (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
                    *local_20 = in_stack_fffffffffffffc50._content;
                    Kernel::Inference::~Inference(&local_278);
                    in_stack_fffffffffffffc4c = Shell::Options::proofExtra(Lib::env);
                    if (in_stack_fffffffffffffc4c == FULL) {
                      in_stack_fffffffffffffc38 = (int)*local_20;
                      in_stack_fffffffffffffc3c = (int)((ulong)*local_20 >> 0x20);
                      in_stack_fffffffffffffc40._content = (uint64_t)::operator_new(0x18);
                      RewriteInferenceExtra::RewriteInferenceExtra
                                ((RewriteInferenceExtra *)
                                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                                 in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
                      Lib::ProofExtra::insert
                                ((ProofExtra *)in_stack_fffffffffffffc40._content,
                                 (Unit *)CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),
                                 (InferenceExtra *)in_stack_fffffffffffffc30);
                    }
                    local_1 = 1;
                    local_e4 = 1;
                    Lib::
                    Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    ::~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                                 *)in_stack_fffffffffffffc50._content);
                  }
                }
                else {
                  local_e4 = 7;
                }
              }
            }
            anon_unknown_6::Applicator::~Applicator((Applicator *)0x7b38bd);
            anon_unknown_6::ApplicatorWithEqSort::~ApplicatorWithEqSort
                      ((ApplicatorWithEqSort *)0x7b38ca);
            Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
                      ((SmartPtr<Indexing::ResultSubstitution> *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          }
          else {
            local_e4 = 7;
          }
LAB_007b3902:
          Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>
          ::~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>
                       *)0x7b390f);
        } while (local_e4 == 7);
        Lib::
        VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
        ::~VirtualIterator((VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
                            *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      } while (local_e4 == 0);
LAB_007b3974:
      Kernel::FirstOrderSubtermIt::~FirstOrderSubtermIt
                ((FirstOrderSubtermIt *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      if (local_e4 != 0) goto LAB_007b39bf;
    }
  }
  local_1 = 0;
LAB_007b39bf:
  return (bool)(local_1 & 1);
}

Assistant:

bool ForwardDemodulationImpl<combinatorySupSupport>::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  TIME_TRACE("forward demodulation");

  Ordering& ordering = _salg->getOrdering();

  //Perhaps it might be a good idea to try to
  //replace subterms in some special order, like
  //the heaviest first...

  static DHSet<TermList> attempted;
  attempted.reset();

  unsigned cLen=cl->length();
  for(unsigned li=0;li<cLen;li++) {
    Literal* lit=(*cl)[li];
    if (lit->isAnswerLiteral()) {
      continue;
    }
    if (_skipNonequationalLiterals && !lit->isEquality()) {
      continue;
    }
    typename std::conditional<!combinatorySupSupport,
      NonVariableNonTypeIterator,
      FirstOrderSubtermIt>::type it(lit);
    while(it.hasNext()) {
      TypedTermList trm = it.next();
      if(!attempted.insert(trm)) {
        //We have already tried to demodulate the term @b trm and did not
        //succeed (otherwise we would have returned from the function).
        //If we have tried the term @b trm, we must have tried to
        //demodulate also its subterms, so we can skip them too.
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _index->getGeneralizations(trm.term(), /* retrieveSubstitutions */ true);
      while(git.hasNext()) {
        auto qr=git.next();
        ASS_EQ(qr.data->clause->length(),1);

        if(!ColorHelper::compatible(cl->color(), qr.data->clause->color())) {
          continue;
        }

        auto lhs = qr.data->term;

        // TODO:
        // to deal with polymorphic matching
        // Ideally, we would like to extend the substitution
        // returned by the index to carry out the sort match.
        // However, ForwardDemodulation uses a CodeTree as its
        // indexing mechanism, and it is not clear how to extend
        // the substitution returned by a code tree.
        static RobSubstitution eqSortSubs;
        if(lhs.isVar()){
          eqSortSubs.reset();
          TermList querySort = trm.sort();
          TermList eqSort = qr.data->term.sort();
          if(!eqSortSubs.match(eqSort, 0, querySort, 1)){
            continue;
          }
        }

        auto subs = qr.unifier;
        ASS(subs->isIdentityOnQueryWhenResultBound());

        ApplicatorWithEqSort applWithEqSort(subs.ptr(), eqSortSubs);
        Applicator applWithoutEqSort(subs.ptr());
        auto appl = lhs.isVar() ? (SubstApplicator*)&applWithEqSort : (SubstApplicator*)&applWithoutEqSort;

        AppliedTerm rhsApplied(qr.data->rhs,appl,true);
        bool preordered = qr.data->preordered;

        ASS_EQ(ordering.compare(trm,rhsApplied),Ordering::reverse(ordering.compare(rhsApplied,trm)));

        if (_useTermOrderingDiagrams) {
#if VDEBUG
          auto dcomp = ordering.compareUnidirectional(trm,rhsApplied);
#endif
          qr.data->tod->init(appl);
          if (!preordered && (_preorderedOnly || !qr.data->tod->next())) {
            ASS_NEQ(dcomp,Ordering::GREATER);
            continue;
          }
          ASS_EQ(dcomp,Ordering::GREATER);
        } else {
          if (!preordered && (_preorderedOnly || ordering.compareUnidirectional(trm,rhsApplied)!=Ordering::GREATER)) {
            continue;
          }
        }

        // encompassing demodulation is fine when rewriting the smaller guy
        if (redundancyCheck && _encompassing) {
          // this will only run at most once;
          // could have been factored out of the getGeneralizations loop,
          // but then it would run exactly once there
          Ordering::Result litOrder = ordering.getEqualityArgumentOrder(lit);
          if ((trm==*lit->nthArgument(0) && litOrder == Ordering::LESS) ||
              (trm==*lit->nthArgument(1) && litOrder == Ordering::GREATER)) {
            redundancyCheck = false;
          }
        }

        TermList rhsS = rhsApplied.apply();

        if (redundancyCheck && !_helper.isPremiseRedundant(cl, lit, trm, rhsS, lhs, appl)) {
          continue;
        }

        Literal* resLit = EqHelper::replace(lit,trm,rhsS);
        if(EqHelper::isEqTautology(resLit)) {
          env.statistics->forwardDemodulationsToEqTaut++;
          premises = pvi( getSingletonIterator(qr.data->clause));
          return true;
        }

        RStack<Literal*> resLits;
        resLits->push(resLit);

        for(unsigned i=0;i<cLen;i++) {
          Literal* curr=(*cl)[i];
          if(curr!=lit) {
            resLits->push(curr);
          }
        }

        env.statistics->forwardDemodulations++;

        premises = pvi( getSingletonIterator(qr.data->clause));
        replacement = Clause::fromStack(*resLits, SimplifyingInference2(InferenceRule::FORWARD_DEMODULATION, cl, qr.data->clause));
        if(env.options->proofExtra() == Options::ProofExtra::FULL)
          env.proofExtra.insert(replacement, new ForwardDemodulationExtra(lhs, trm));
        return true;
      }
    }
  }

  return false;
}